

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_integers.cpp
# Opt level: O2

int main(void)

{
  longlong value;
  longlong lVar1;
  long value_00;
  
  for (value_00 = -1000; value_00 != 1000; value_00 = value_00 + 1) {
    value = obme::OBME<long_long>(value_00);
    lVar1 = obme::OBME<long_long>(value);
    printf("%lld: %lld \n",lVar1,value);
  }
  return 1;
}

Assistant:

int main()
{
	long long i = -1000;
	for(; i < 1000; ++i) {
		long long obf = OBME(i);
		printf("%lld: %lld \n", OBME(obf), obf);
	}
	
	return 1;
}